

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_dist_graph_create_
               (MPIABI_Fint *comm_old,MPIABI_Fint *n,int *sources,int *degrees,int *destinations,
               int *weights,MPIABI_Fint *info,MPIABI_Fint *reorder,MPIABI_Fint *comm_dist_graph,
               MPIABI_Fint *ierror)

{
  mpi_dist_graph_create_();
  return;
}

Assistant:

void mpiabi_dist_graph_create_(
  const MPIABI_Fint * comm_old,
  const MPIABI_Fint * n,
  const int * sources,
  const int * degrees,
  const int * destinations,
  const int * weights,
  const MPIABI_Fint * info,
  const MPIABI_Fint * reorder,
  MPIABI_Fint * comm_dist_graph,
  MPIABI_Fint * ierror
) {
  return mpi_dist_graph_create_(
    comm_old,
    n,
    sources,
    degrees,
    destinations,
    weights,
    info,
    reorder,
    comm_dist_graph,
    ierror
  );
}